

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_logger.cpp
# Opt level: O2

Error * ot::commissioner::FileLogger::Create
                  (Error *__return_storage_ptr__,
                  shared_ptr<ot::commissioner::FileLogger> *aFileLogger,string *aFilename,
                  LogLevel aLogLevel)

{
  ErrorCode EVar1;
  FileLogger *__p;
  Error *pEVar2;
  shared_ptr<ot::commissioner::FileLogger> logger;
  undefined1 local_48 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  __p = (FileLogger *)operator_new(0x40);
  (__p->super_Logger)._vptr_Logger = (_func_int **)&PTR__FileLogger_002609c8;
  (__p->mLogMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(__p->mLogMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(__p->mLogMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (__p->mLogMutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
  ;
  (__p->mLogMutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
  ;
  std::__shared_ptr<ot::commissioner::FileLogger,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<ot::commissioner::FileLogger,void>
            ((__shared_ptr<ot::commissioner::FileLogger,(__gnu_cxx::_Lock_policy)2> *)&logger,__p);
  Init((Error *)local_48,
       logger.super___shared_ptr<ot::commissioner::FileLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
       aFilename,aLogLevel);
  pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_48);
  EVar1 = pEVar2->mCode;
  std::__cxx11::string::~string((string *)(local_48 + 8));
  if (EVar1 == kNone) {
    std::__shared_ptr<ot::commissioner::FileLogger,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&aFileLogger->
                super___shared_ptr<ot::commissioner::FileLogger,_(__gnu_cxx::_Lock_policy)2>,
               &logger.super___shared_ptr<ot::commissioner::FileLogger,_(__gnu_cxx::_Lock_policy)2>)
    ;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&logger.super___shared_ptr<ot::commissioner::FileLogger,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Error FileLogger::Create(std::shared_ptr<FileLogger> &aFileLogger, const std::string &aFilename, LogLevel aLogLevel)
{
    Error error;
    auto  logger = std::shared_ptr<FileLogger>(new FileLogger);

    SuccessOrExit(error = logger->Init(aFilename, aLogLevel));
    aFileLogger = logger;

exit:
    return error;
}